

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_traits.h
# Opt level: O1

Field google::protobuf::json_internal::Proto3Type::MustHaveField(Message *d,uint number)

{
  Field *pFVar1;
  undefined8 *puVar2;
  LogMessageFatal local_70 [16];
  string local_60 [32];
  undefined8 local_40;
  undefined8 local_38;
  undefined8 *local_30;
  code *local_28;
  ulong local_20;
  code *local_18;
  
  pFVar1 = ResolverPool::Message::FindField(d,number);
  if (pFVar1 != (Field *)0x0) {
    return pFVar1;
  }
  absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
            (local_70,
             "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/protobuf-src/src/google/protobuf/json/internal/descriptor_traits.h"
             ,0x154);
  puVar2 = (undefined8 *)
           ((ulong)(d->raw_).field_0._impl_.name_.tagged_ptr_.ptr_ & 0xfffffffffffffffc);
  local_38 = *puVar2;
  local_40 = puVar2[1];
  local_30 = &local_40;
  local_28 = absl::lts_20240722::str_format_internal::FormatArgImpl::
             Dispatch<std::basic_string_view<char,std::char_traits<char>>>;
  local_20 = (ulong)number;
  local_18 = absl::lts_20240722::str_format_internal::FormatArgImpl::Dispatch<int>;
  absl::lts_20240722::str_format_internal::FormatPack_abi_cxx11_
            (local_60,
             "%s has, by definition, a field numbered %d, but it could not be looked up; this is a bug"
             ,0x58,&local_30,2);
  absl::lts_20240722::log_internal::LogMessage::operator<<((LogMessage *)local_70,local_60);
  std::__cxx11::string::~string(local_60);
  absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal(local_70);
}

Assistant:

static Field MustHaveField(const Desc& d, int32_t number,
                             JsonLocation::SourceLocation loc =
                                 JsonLocation::SourceLocation::current()) {
    auto f = FieldByNumber(d, number);
    if (!f.has_value()) {
      ABSL_LOG(FATAL)
          << absl::StrFormat(
                 "%s has, by definition, a field numbered %d, but it could not "
                 "be "
                 "looked up; this is a bug",
                 TypeName(d), number);
    }
    return *f;
  }